

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmTrapcc<(moira::Instr)160,(moira::Mode)12,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  
  cVar4 = 't';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    lVar3 = 1;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar4;
      cVar4 = "ptrapcs"[lVar3 + 1];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 7);
  }
  else {
    lVar3 = 1;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar4;
      cVar4 = "ptrapcs"[lVar3 + 1];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 7);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      do {
        pcVar2 = str->ptr;
        str->ptr = pcVar2 + 1;
        *pcVar2 = ' ';
      } while (str->ptr < str->base + iVar1);
    }
  }
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar4 = ';';
    lVar3 = 1;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar4;
      cVar4 = "trap%-2s  ; (2+)"[lVar3 + 10];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmTrapcc(StrWriter &str, u32 &addr, u16 op) const
{
    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (S) {

                case Byte:

                    str << Ins<I>{};
                    break;

                case Word:
                case Long:

                    auto ext = dasmIncRead<S>(addr);
                    str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(ext);
                    break;
            }
            break;

        default:

            switch (S) {

                case Byte:

                    str << Ins<I>{} << str.tab;
                    break;

                case Word:
                case Long:

                    auto ext = dasmIncRead<S>(addr);
                    str << Ins<I>{} << str.tab << Imu(ext);
                    break;
            }
    }

    str << Av<I, M, S>{};
}